

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpConnectionCloseEntityReader::tryRead
          (HttpConnectionCloseEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  HttpInputStreamImpl *this_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<unsigned_long> PVar2;
  undefined1 local_50 [24];
  size_t local_38;
  Own<kj::_::PromiseNode> local_30;
  
  if (*(char *)((long)buffer + 0x10) == '\x01') {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    pPVar1 = extraout_RDX;
  }
  else {
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)local_50,*(void **)((long)buffer + 8),minBytes,maxBytes);
    this_00 = (HttpInputStreamImpl *)operator_new(0x38);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_50,
               _::
               TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1471:15),_kj::_::PropagateException>
               ::anon_class_16_2_9bbca49e_for_func::operator());
    (this_00->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_onReady_004282e0;
    (this_00->headerBuffer).disposer = (ArrayDisposer *)maxBytes;
    this_00->messageHeaderEnd = (size_t)buffer;
    local_50._16_8_ =
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpConnectionCloseEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_30.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpConnectionCloseEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_38 = 0;
    (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::(anonymous_namespace)::HttpConnectionCloseEntityReader::tryRead(void*,unsigned_long,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    (this->super_HttpEntityBodyReader).inner = this_00;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_30);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_50 + 0x10));
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_50);
    pPVar1 = extraout_RDX_00;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (alreadyDone()) return size_t(0);

    return inner.tryRead(buffer, minBytes, maxBytes)
        .then([=](size_t amount) {
      if (amount < minBytes) {
        doneReading();
      }
      return amount;
    });
  }